

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftraster.c
# Opt level: O3

int Render_Single_Pass(black_PWorker worker,Bool flipped,Int y_min,Int y_max)

{
  Int *pIVar1;
  ushort uVar2;
  undefined4 uVar3;
  char *pcVar4;
  short sVar5;
  Bool BVar6;
  char cVar7;
  short sVar8;
  uint uVar9;
  long lVar10;
  Long LVar11;
  long lVar12;
  PProfile pTVar13;
  int iVar14;
  long lVar15;
  ulong uVar16;
  ulong uVar17;
  int iVar18;
  undefined4 in_register_00000014;
  ulong uVar19;
  PProfile *ppTVar20;
  ushort uVar21;
  byte *pbVar22;
  ulong uVar23;
  long lVar24;
  PProfile pTVar25;
  byte bVar26;
  long lVar27;
  PProfile pTVar28;
  ulong uVar29;
  long lVar30;
  long lVar31;
  long lVar32;
  FT_Vector *pFVar33;
  Int y;
  FT_Vector *pFVar34;
  PProfile pTVar35;
  PProfile_conflict pTVar36;
  TProfileList draw_left;
  TProfileList waiting;
  Int band_stack [32];
  long local_110;
  long local_108;
  PProfile local_100;
  PProfile local_f8;
  PProfile local_f0;
  long local_e8;
  ulong local_e0;
  ulong local_d8;
  PProfile local_d0;
  ulong local_c8;
  ulong local_c0;
  uint auStack_b8 [34];
  
  local_e0 = CONCAT44(in_register_00000014,y_min);
  local_c8 = 0;
  local_d8 = 0;
LAB_0023aaf9:
  local_e8 = (long)(int)local_e0;
  do {
    worker->minY = (long)(int)local_c8 * (long)worker->precision;
    worker->maxY = worker->precision * local_e8;
    pTVar36 = (PProfile_conflict)worker->buff;
    worker->top = (PLong)pTVar36;
    worker->error = 0;
    worker->numTurns = 0;
    worker->fProfile = (PProfile_conflict)0x0;
    worker->fresh = '\0';
    worker->joint = '\0';
    worker->maxBuff = worker->sizeBuff + -8;
    worker->cProfile = pTVar36;
    pTVar36->offset = (PLong)pTVar36;
    worker->num_Profs = 0;
    if ((worker->outline).n_contours < 1) {
LAB_0023b048:
      worker->fProfile = (PProfile_conflict)0x0;
    }
    else {
      pTVar13 = (PProfile)0x0;
      uVar21 = 0;
      do {
        worker->state = Unknown_State;
        worker->gProfile = (PProfile_conflict)0x0;
        pFVar33 = (worker->outline).points;
        uVar2 = (worker->outline).contours[(long)pTVar13];
        lVar30 = (long)worker->precision_scale;
        lVar32 = (long)worker->precision_half;
        local_108 = pFVar33[uVar21].x * lVar30 - lVar32;
        lVar24 = pFVar33[uVar21].y * lVar30 - lVar32;
        lVar10 = pFVar33[uVar2].x * lVar30 - lVar32;
        lVar32 = lVar30 * pFVar33[uVar2].y - lVar32;
        lVar30 = lVar32;
        local_110 = lVar24;
        if (flipped != '\0') {
          lVar30 = lVar10;
          lVar10 = lVar32;
          local_110 = local_108;
          local_108 = lVar24;
        }
        pcVar4 = (worker->outline).tags;
        pbVar22 = (byte *)(pcVar4 + uVar21);
        bVar26 = pcVar4[uVar21];
        if ((bVar26 & 4) != 0) {
          worker->dropOutControl = bVar26 >> 5;
          bVar26 = *pbVar22;
        }
        pFVar34 = pFVar33 + uVar2;
        pFVar33 = pFVar33 + uVar21;
        if ((bVar26 & 3) == 0) {
          if ((pcVar4[uVar2] & 3U) == 1) {
            pFVar34 = pFVar34 + -1;
          }
          else {
            lVar10 = (lVar10 + local_108) / 2;
            lVar30 = (lVar30 + local_110) / 2;
          }
          pFVar33 = pFVar33 + -1;
          pbVar22 = pbVar22 + -1;
          local_110 = lVar30;
          local_108 = lVar10;
        }
        else if ((bVar26 & 3) == 2) goto LAB_0023b516;
        worker->lastX = local_108;
        worker->lastY = local_110;
        local_d0 = pTVar13;
        while (pFVar33 < pFVar34) {
          if ((pbVar22[1] & 3) == 0) {
            lVar30 = pFVar33[1].x * (long)worker->precision_scale - (long)worker->precision_half;
            lVar24 = (long)worker->precision_scale * pFVar33[1].y - (long)worker->precision_half;
            lVar10 = lVar24;
            if (flipped != '\0') {
              lVar10 = lVar30;
              lVar30 = lVar24;
            }
            pbVar22 = pbVar22 + 2;
            pFVar33 = pFVar33 + 2;
            while( true ) {
              if (pFVar34 <= pFVar33 + -1) {
                cVar7 = Conic_To(worker,lVar30,lVar10,local_108,local_110);
                goto LAB_0023aec3;
              }
              lVar12 = pFVar33->x * (long)worker->precision_scale - (long)worker->precision_half;
              lVar32 = (long)worker->precision_scale * pFVar33->y - (long)worker->precision_half;
              lVar24 = lVar32;
              if (flipped == '\0') {
                lVar24 = lVar12;
              }
              if (flipped != '\0') {
                lVar32 = lVar12;
              }
              if ((*pbVar22 & 3) != 0) break;
              BVar6 = Conic_To(worker,lVar30,lVar10,(lVar24 + lVar30) / 2,(lVar32 + lVar10) / 2);
              pbVar22 = pbVar22 + 1;
              pFVar33 = pFVar33 + 1;
              lVar10 = lVar32;
              lVar30 = lVar24;
              if (BVar6 != '\0') goto LAB_0023b05d;
            }
            if ((*pbVar22 & 3) != 1) goto LAB_0023b516;
            BVar6 = Conic_To(worker,lVar30,lVar10,lVar24,lVar32);
            if (BVar6 != '\0') goto LAB_0023b05d;
          }
          else if ((pbVar22[1] & 3) == 1) {
            LVar11 = pFVar33[1].x * (long)worker->precision_scale - (long)worker->precision_half;
            lVar10 = (long)worker->precision_scale * pFVar33[1].y - (long)worker->precision_half;
            lVar30 = lVar10;
            if (flipped != '\0') {
              lVar30 = LVar11;
              LVar11 = lVar10;
            }
            BVar6 = Line_To(worker,LVar11,lVar30);
            if (BVar6 != '\0') goto LAB_0023b05d;
            pbVar22 = pbVar22 + 1;
            pFVar33 = pFVar33 + 1;
          }
          else {
            if ((pFVar34 < pFVar33 + 2) || ((pbVar22[2] & 3) != 2)) goto LAB_0023b516;
            lVar12 = (long)worker->precision_scale;
            lVar27 = (long)worker->precision_half;
            lVar24 = pFVar33[1].x * lVar12 - lVar27;
            lVar15 = pFVar33[1].y * lVar12 - lVar27;
            lVar31 = pFVar33[2].x * lVar12 - lVar27;
            lVar32 = pFVar33[2].y * lVar12 - lVar27;
            lVar30 = lVar31;
            lVar10 = lVar15;
            if (flipped != '\0') {
              lVar30 = lVar32;
              lVar10 = lVar24;
              lVar24 = lVar15;
              lVar32 = lVar31;
            }
            if (pFVar34 < pFVar33 + 3) {
              cVar7 = Cubic_To(worker,lVar24,lVar10,lVar30,lVar32,local_108,local_110);
              goto LAB_0023aec3;
            }
            LVar11 = pFVar33[3].x * lVar12 - lVar27;
            lVar27 = lVar12 * pFVar33[3].y - lVar27;
            lVar12 = lVar27;
            if (flipped != '\0') {
              lVar12 = LVar11;
              LVar11 = lVar27;
            }
            BVar6 = Cubic_To(worker,lVar24,lVar10,lVar30,lVar32,LVar11,lVar12);
            if (BVar6 != '\0') goto LAB_0023b05d;
            pbVar22 = pbVar22 + 3;
            pFVar33 = pFVar33 + 3;
          }
        }
        cVar7 = Line_To(worker,local_108,local_110);
LAB_0023aec3:
        pTVar13 = local_d0;
        if (cVar7 != '\0') goto LAB_0023b05d;
        uVar23 = worker->lastY;
        sVar8 = (worker->outline).contours[(long)local_d0];
        iVar14 = worker->precision;
        uVar16 = (long)iVar14 - 1U & uVar23;
        if ((((uVar16 == 0) && (worker->minY <= (long)uVar23)) && ((long)uVar23 <= worker->maxY)) &&
           ((worker->gProfile != (PProfile_conflict)0x0 &&
            (((worker->cProfile->flags ^ worker->gProfile->flags) & 8) == 0)))) {
          worker->top = worker->top + -1;
        }
        pTVar36 = worker->cProfile;
        if ((worker->top == pTVar36->offset) || ((pTVar36->flags & 8) == 0)) {
          uVar16 = ((long)-iVar14 & (uVar23 + (long)iVar14) - 1) - uVar23;
        }
        BVar6 = End_Profile(worker,(long)worker->precision_half <= (long)uVar16);
        if (BVar6 != '\0') goto LAB_0023b05d;
        if (worker->gProfile != (PProfile)0x0) {
          pTVar36->next = worker->gProfile;
        }
        uVar21 = sVar8 + 1;
        pTVar13 = (PProfile)((long)&pTVar13->X + 1);
      } while ((long)pTVar13 < (long)(worker->outline).n_contours);
      uVar21 = worker->num_Profs;
      pTVar36 = worker->fProfile;
      if (pTVar36 == (PProfile_conflict)0x0 || uVar21 < 2) goto LAB_0023b048;
      do {
        if (uVar21 < 2) {
          pTVar13 = (PProfile)0x0;
        }
        else {
          pTVar13 = (PProfile)(pTVar36->offset + pTVar36->height);
        }
        pTVar36->link = pTVar13;
        iVar14 = (int)pTVar36->start;
        if ((pTVar36->flags & 8) == 0) {
          iVar18 = (iVar14 - (int)pTVar36->height) + 1;
          pTVar36->start = (long)iVar18;
          pTVar36->offset = pTVar36->offset + pTVar36->height + -1;
          y = iVar14 + 1;
          iVar14 = iVar18;
        }
        else {
          y = (int)pTVar36->height + iVar14;
        }
        BVar6 = Insert_Y_Turn(worker,iVar14);
        if ((BVar6 != '\0') || (BVar6 = Insert_Y_Turn(worker,y), BVar6 != '\0')) goto LAB_0023b05d;
        pTVar36 = pTVar36->link;
        uVar21 = uVar21 - 1;
      } while (uVar21 != 0);
    }
    if (worker->top < worker->maxBuff) break;
LAB_0023b05d:
    if (worker->error != 0x62) {
      return worker->error;
    }
    uVar9 = (uint)local_c8;
    if (uVar9 == (uint)local_e0) {
      return 0x62;
    }
    auStack_b8[(int)local_d8] = uVar9;
    local_d8 = (ulong)((int)local_d8 + 1);
    local_c8 = (ulong)(((int)((uint)local_e0 + uVar9) >> 1) + 1);
  } while( true );
  if (worker->fProfile != (PProfile)0x0) {
    local_f0 = (PProfile)0x0;
    local_f8 = (PProfile)0x0;
    local_100 = (PProfile)0x0;
    bVar26 = (byte)worker->precision_bits;
    uVar16 = worker->minY >> (bVar26 & 0x3f);
    uVar23 = worker->maxY >> (bVar26 & 0x3f);
    pTVar13 = worker->fProfile;
    do {
      uVar17 = pTVar13->start;
      if ((short)uVar17 <= (short)uVar23) {
        uVar23 = uVar17;
      }
      uVar23 = uVar23 & 0xffffffff;
      uVar9 = ((int)uVar17 + (int)pTVar13->height) - 1;
      sVar8 = (short)uVar16;
      uVar16 = uVar16 & 0xffffffff;
      if (sVar8 <= (short)uVar9) {
        uVar16 = (ulong)uVar9;
      }
      pTVar35 = pTVar13->link;
      pTVar13->X = 0;
      ppTVar20 = &local_f0;
      if (local_f0 == (PProfile)0x0) {
        pTVar25 = (PProfile)0x0;
      }
      else {
        pTVar25 = local_f0;
        if (local_f0->X < 1) {
          do {
            pTVar28 = pTVar25;
            pTVar25 = pTVar28->link;
            if (pTVar25 == (PProfile)0x0) {
              pTVar25 = (PProfile)0x0;
              break;
            }
          } while (pTVar25->X < 1);
          ppTVar20 = &pTVar28->link;
        }
      }
      pTVar13->link = pTVar25;
      *ppTVar20 = pTVar13;
      pTVar13 = pTVar35;
    } while (pTVar35 != (PProfile)0x0);
    if (worker->numTurns == 0) {
LAB_0023b516:
      worker->error = 0x14;
      return 0x14;
    }
    sVar8 = (short)uVar23;
    (*worker->Proc_Sweep_Init)(worker,sVar8,(Short)uVar16);
    for (pTVar13 = local_f0; pTVar13 != (PProfile)0x0; pTVar13 = pTVar13->link) {
      pTVar13->countL = (int)pTVar13->start - (int)sVar8;
    }
    iVar14 = worker->numTurns;
    if ((0 < (long)iVar14) &&
       ((worker->sizeBuff[-(long)iVar14] != (long)sVar8 ||
        (worker->numTurns = iVar14 + -1, iVar14 != 1)))) {
      iVar14 = 0;
      local_c0 = uVar16;
LAB_0023b1aa:
      if (local_f0 != (PProfile)0x0) {
        pTVar13 = local_f0;
LAB_0023b1bb:
        pTVar35 = pTVar13->link;
        pIVar1 = &pTVar13->countL;
        *pIVar1 = *pIVar1 - (int)(short)iVar14;
        if (*pIVar1 == 0) {
          if (local_f0 != (PProfile)0x0) {
            pTVar25 = local_f0;
            ppTVar20 = &local_f0;
            if (local_f0 != pTVar13) {
              do {
                pTVar28 = pTVar25;
                pTVar25 = pTVar28->link;
                if (pTVar25 == (PProfile)0x0) goto LAB_0023b1f6;
              } while (pTVar25 != pTVar13);
              ppTVar20 = &pTVar28->link;
            }
            *ppTVar20 = pTVar25->link;
          }
LAB_0023b1f6:
          lVar30 = pTVar13->X;
          if ((pTVar13->flags & 8) == 0) {
            if (local_100 == (PProfile)0x0) {
              pTVar25 = (PProfile)0x0;
              ppTVar20 = &local_100;
              goto LAB_0023b265;
            }
            ppTVar20 = &local_100;
            pTVar25 = local_100;
            if (lVar30 < local_100->X) goto LAB_0023b265;
            do {
              pTVar28 = pTVar25;
              pTVar25 = pTVar28->link;
              if (pTVar25 == (PProfile)0x0) goto LAB_0023b25f;
            } while (pTVar25->X <= lVar30);
            goto LAB_0023b261;
          }
          if (local_f8 == (PProfile)0x0) {
            pTVar25 = (PProfile)0x0;
            ppTVar20 = &local_f8;
          }
          else {
            ppTVar20 = &local_f8;
            pTVar25 = local_f8;
            if (local_f8->X <= lVar30) {
              do {
                pTVar28 = pTVar25;
                pTVar25 = pTVar28->link;
                if (pTVar25 == (PProfile)0x0) goto LAB_0023b25f;
              } while (pTVar25->X <= lVar30);
              goto LAB_0023b261;
            }
          }
          goto LAB_0023b265;
        }
        goto LAB_0023b26c;
      }
LAB_0023b278:
      Sort(&local_f8);
      Sort(&local_100);
      iVar14 = worker->numTurns;
      worker->numTurns = iVar14 + -1;
      uVar3 = (undefined4)worker->sizeBuff[-(long)iVar14];
      local_e0 = CONCAT44(local_e0._4_4_,uVar3);
      sVar8 = (short)uVar3;
      iVar14 = (int)uVar23;
      local_e8 = CONCAT44(local_e8._4_4_,iVar14);
      pTVar13 = local_f8;
      uVar17 = local_c0;
      if ((short)uVar23 < sVar8) {
        do {
          pTVar35 = local_100;
          pTVar13 = local_f8;
          if (local_100 != (PProfile)0x0 && local_f8 != (PProfile)0x0) {
            sVar5 = 0;
            local_d0 = local_f8;
            pTVar28 = local_100;
            pTVar25 = local_f8;
            do {
              uVar16 = pTVar25->X;
              uVar17 = pTVar28->X;
              lVar10 = uVar16 - uVar17;
              lVar30 = lVar10;
              if (lVar10 == 0 || (long)uVar16 < (long)uVar17) {
                lVar30 = -(uVar16 - uVar17);
              }
              uVar19 = uVar17;
              if ((long)uVar16 < (long)uVar17) {
                uVar19 = uVar16;
              }
              if (lVar10 != 0 && (long)uVar17 <= (long)uVar16) {
                uVar17 = uVar16;
              }
              lVar10 = (long)worker->precision;
              if (lVar10 < lVar30) {
LAB_0023b34e:
                (*worker->Proc_Sweep_Span)(worker,(Short)uVar23,uVar19,uVar17,pTVar25,pTVar28);
              }
              else {
                uVar16 = uVar19 & -lVar10;
                if (((uVar16 == uVar19) ||
                    (uVar29 = (uVar17 + lVar10) - 1 & -lVar10, uVar29 == uVar17)) ||
                   (((long)uVar16 <= (long)uVar29 && (uVar29 != uVar16 + lVar10))))
                goto LAB_0023b34e;
                if ((pTVar25->flags & 7) != 2) {
                  pTVar25->X = uVar19;
                  pTVar28->X = uVar17;
                  pTVar25->countL = 1;
                  sVar5 = sVar5 + 1;
                }
              }
              pTVar13 = local_d0;
              pTVar25 = pTVar25->link;
            } while ((pTVar25 != (PProfile)0x0) &&
                    (pTVar28 = pTVar28->link, pTVar28 != (PProfile)0x0));
            pTVar25 = local_d0;
            if (0 < sVar5) {
              do {
                if (pTVar25->countL != 0) {
                  pTVar25->countL = 0;
                  (*worker->Proc_Sweep_Drop)
                            (worker,(Short)uVar23,pTVar25->X,pTVar35->X,pTVar25,pTVar35);
                }
                pTVar25 = pTVar25->link;
              } while ((pTVar25 != (PProfile)0x0) &&
                      (pTVar35 = pTVar35->link, pTVar35 != (PProfile)0x0));
            }
          }
          (*worker->Proc_Sweep_Step)(worker);
          uVar9 = (int)uVar23 + 1;
          uVar23 = (ulong)uVar9;
          if (sVar8 <= (short)uVar9) goto LAB_0023b420;
          Sort(&local_f8);
          Sort(&local_100);
        } while( true );
      }
      goto joined_r0x0023b42d;
    }
LAB_0023b4f3:
    for (; (short)uVar23 <= (short)uVar16; uVar23 = (ulong)((int)uVar23 + 1)) {
      (*worker->Proc_Sweep_Step)(worker);
    }
  }
  if ((int)local_d8 < 1) {
    return 0;
  }
  local_d8 = (ulong)((int)local_d8 - 1);
  local_e0 = (ulong)((int)local_c8 - 1);
  local_c8 = (ulong)auStack_b8[local_d8];
  goto LAB_0023aaf9;
LAB_0023b25f:
  pTVar25 = (PProfile)0x0;
LAB_0023b261:
  ppTVar20 = &pTVar28->link;
LAB_0023b265:
  pTVar13->link = pTVar25;
  *ppTVar20 = pTVar13;
LAB_0023b26c:
  pTVar13 = pTVar35;
  if (pTVar35 == (PProfile)0x0) goto LAB_0023b278;
  goto LAB_0023b1bb;
LAB_0023b420:
  uVar17 = local_c0;
  iVar14 = (int)local_e8;
joined_r0x0023b42d:
  pTVar35 = pTVar13;
  uVar16 = local_c0;
  pTVar13 = local_100;
  local_c0 = uVar17;
  if (pTVar35 != (PProfile)0x0) {
    pTVar13 = pTVar35->link;
    local_c0 = uVar16;
    if (local_f8 != (PProfile)0x0 && pTVar35->height == 0) {
      ppTVar20 = &local_f8;
      pTVar25 = local_f8;
      if (local_f8 != pTVar35) {
        do {
          pTVar28 = pTVar25;
          pTVar25 = pTVar28->link;
          if (pTVar25 == (PProfile)0x0) goto joined_r0x0023b42d;
        } while (pTVar25 != pTVar35);
        ppTVar20 = &pTVar28->link;
      }
      local_c0 = uVar17;
      *ppTVar20 = pTVar25->link;
      uVar17 = local_c0;
      local_c0 = uVar16;
    }
    goto joined_r0x0023b42d;
  }
joined_r0x0023b487:
  pTVar35 = pTVar13;
  if (pTVar35 != (PProfile)0x0) {
    pTVar13 = pTVar35->link;
    if (local_100 != (PProfile)0x0 && pTVar35->height == 0) {
      ppTVar20 = &local_100;
      pTVar25 = local_100;
      if (local_100 != pTVar35) {
        do {
          pTVar28 = pTVar25;
          pTVar25 = pTVar28->link;
          if (pTVar25 == (PProfile)0x0) goto joined_r0x0023b487;
        } while (pTVar25 != pTVar35);
        ppTVar20 = &pTVar28->link;
      }
      *ppTVar20 = pTVar25->link;
    }
    goto joined_r0x0023b487;
  }
  iVar14 = (int)local_e0 - iVar14;
  if (worker->numTurns < 1) goto LAB_0023b4f3;
  goto LAB_0023b1aa;
}

Assistant:

static int
  Render_Single_Pass( RAS_ARGS Bool  flipped,
                               Int   y_min,
                               Int   y_max )
  {
    Int  y_mid;
    Int  band_top = 0;
    Int  band_stack[32];  /* enough to bisect 32-bit int bands */


    while ( 1 )
    {
      ras.minY = (Long)y_min * ras.precision;
      ras.maxY = (Long)y_max * ras.precision;

      ras.top = ras.buff;

      ras.error = Raster_Err_Ok;

      if ( Convert_Glyph( RAS_VARS flipped ) )
      {
        if ( ras.error != Raster_Err_Raster_Overflow )
          return ras.error;

        /* sub-banding */

        if ( y_min == y_max )
          return ras.error;  /* still Raster_Overflow */

        y_mid = ( y_min + y_max ) >> 1;

        band_stack[band_top++] = y_min;
        y_min                  = y_mid + 1;
      }
      else
      {
        if ( ras.fProfile )
          if ( Draw_Sweep( RAS_VAR ) )
             return ras.error;

        if ( --band_top < 0 )
          break;

        y_max = y_min - 1;
        y_min = band_stack[band_top];
      }
    }

    return Raster_Err_Ok;
  }